

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

Color * __thiscall
scene::World::shade(Color *__return_storage_ptr__,World *this,Computation *comp,int recursion_depth)

{
  Light *pLVar1;
  element_type *peVar2;
  bool bVar3;
  pointer ppLVar4;
  undefined8 uVar5;
  World *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  double rhs;
  Color reflected;
  Color refracted;
  Color local_a8;
  Color local_90;
  World local_78;
  
  image::Color::Color(__return_storage_ptr__,0.0,0.0,0.0);
  ppLVar4 = (this->m_lights).
            super__Vector_base<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_lights).
      super__Vector_base<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppLVar4) {
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      bVar3 = shadow(this,ppLVar4[(long)p_Var6],&comp->m_over_point);
      if (!bVar3) {
        ppLVar4 = (this->m_lights).
                  super__Vector_base<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            ((long)(this->m_lights).
                   super__Vector_base<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar4 >> 3) <= p_Var6) {
          uVar5 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,p_Var6);
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
          _Unwind_Resume(uVar5);
        }
        pLVar1 = ppLVar4[(long)p_Var6];
        (*pLVar1->_vptr_Light[1])(&local_90,pLVar1,comp);
        image::operator+=(__return_storage_ptr__,&local_90);
      }
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var6->_vptr__Sp_counted_base + 1);
      ppLVar4 = (this->m_lights).
                super__Vector_base<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (p_Var6 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)(this->m_lights).
                             super__Vector_base<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar4 >> 3));
  }
  if (recursion_depth < 5) {
    reflection(&local_90,this,comp,recursion_depth);
    this_00 = &local_78;
    refraction(&this_00->m_ambient,this,comp,recursion_depth);
    peVar2 = (comp->m_object->material).
             super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var6 = (comp->m_object->material).
             super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    if ((peVar2->reflective <= 0.0) || (peVar2->transparency <= 0.0)) {
      image::operator+(&local_90,&local_78.m_ambient);
      image::operator+=(__return_storage_ptr__,&local_a8);
    }
    else {
      rhs = schlick(this_00,comp);
      image::operator*((Color *)&local_78.m_objects,&local_90,rhs);
      image::operator*((Color *)&local_78.m_lights,&local_78.m_ambient,1.0 - rhs);
      image::operator+((Color *)&local_78.m_objects,(Color *)&local_78.m_lights);
      image::operator+=(__return_storage_ptr__,&local_a8);
    }
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
  }
  geometry::primitive::Primitive::color(&local_a8,comp->m_object,&comp->m_point);
  image::hadamard_product(&this->m_ambient,&local_a8);
  image::operator*(&local_90,&local_78.m_ambient,
                   ((comp->m_object->material).
                    super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   ambient);
  image::operator+=(__return_storage_ptr__,&local_90);
  return __return_storage_ptr__;
}

Assistant:

image::Color scene::World::shade(const core::Computation &comp, int recursion_depth) const
{
    image::Color ret{0, 0, 0};

    // surface
    for (int i = 0; i < m_lights.size(); i++)
    {
	bool shadowed = shadow(m_lights.at(i), comp.over_point());
	if (!shadowed)
	    ret += m_lights.at(i)->lighting(comp);
    }

    // reflection and refraction
    if (recursion_depth < 5)
    {
	image::Color reflected = reflection(comp, recursion_depth);
	image::Color refracted = refraction(comp, recursion_depth);

	std::shared_ptr<material::Material> mat = comp.object()->material;
	if (mat->reflective > 0 && mat->transparency > 0)
	{
	    double reflectance = schlick(comp);
	    ret += reflected * reflectance + refracted * (1 - reflectance);
	}
	else
	    ret += reflected + refracted;
    }

    // ambient
    ret += image::hadamard_product(m_ambient, comp.object()->color(comp.point())) * comp.object()->material->ambient;

    return ret;
}